

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

int lws_cache_heap_get(lws_cache_ttl_lru *_c,char *specific_key,void **pdata,size_t *psize)

{
  lws_cache_ttl_item_heap_t *plVar1;
  lws_cache_ttl_item_heap_t *item;
  lws_cache_ttl_lru_t_heap_t *cache;
  size_t *psize_local;
  void **pdata_local;
  char *specific_key_local;
  lws_cache_ttl_lru *_c_local;
  
  plVar1 = lws_cache_heap_specific((lws_cache_ttl_lru_t_heap_t *)_c,specific_key);
  if (plVar1 == (lws_cache_ttl_item_heap_t *)0x0) {
    _c_local._4_4_ = 1;
  }
  else {
    lws_dll2_remove(&plVar1->list_lru);
    lws_dll2_add_head(&plVar1->list_lru,(lws_dll2_owner *)&_c[1].info.parent);
    if (pdata != (void **)0x0) {
      *pdata = plVar1 + 1;
      *psize = plVar1->size;
    }
    _c_local._4_4_ = 0;
  }
  return _c_local._4_4_;
}

Assistant:

static int
lws_cache_heap_get(struct lws_cache_ttl_lru *_c, const char *specific_key,
		   const void **pdata, size_t *psize)
{
	lws_cache_ttl_lru_t_heap_t *cache = (lws_cache_ttl_lru_t_heap_t *)_c;
	lws_cache_ttl_item_heap_t *item;

	item = lws_cache_heap_specific(cache, specific_key);
	if (!item)
		return 1;

	/* we are using it, move it to lru head */
	lws_dll2_remove(&item->list_lru);
	lws_dll2_add_head(&item->list_lru, &cache->items_lru);

	if (pdata) {
		*pdata = (const void *)&item[1];
		*psize = item->size;
	}

	return 0;
}